

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::genTestFunction_abi_cxx11_(CppGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  QueryCompiler *pQVar3;
  char *in_RSI;
  CppGenerator *in_RDI;
  size_t agg;
  Attribute *attr;
  size_t var;
  string fields;
  View *view;
  size_t viewID;
  string *returnString;
  string *in_stack_fffffffffffff9b8;
  QueryCompiler *in_stack_fffffffffffff9c0;
  Attribute *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  CppGenerator *__rhs_00;
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  QueryCompiler *local_228;
  string local_220 [32];
  string local_200 [32];
  Attribute *local_1e0;
  reference local_1d8;
  ulong local_1c8;
  allocator local_1b9;
  string local_1b8 [32];
  View *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  string local_188 [32];
  string local_168 [32];
  string local_148 [48];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  __rhs_00 = in_RDI;
  offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff9f0);
  std::operator+((char *)in_stack_fffffffffffff9c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff9f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff9f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff9f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff9f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff9f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff9f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_118);
  local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    pbVar1 = local_190;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a42ee);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            QueryCompiler::numberOfViews((QueryCompiler *)0x2a42f6);
    if (__rhs <= pbVar1) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a431e);
    local_198 = QueryCompiler::getView(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
    if (local_198->_origin == local_198->_destination) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"",&local_1b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      for (local_1c8 = 0; local_1c8 < 100; local_1c8 = local_1c8 + 1) {
        std::bitset<100UL>::operator[]
                  ((bitset<100UL> *)in_stack_fffffffffffff9c8,(size_t)in_stack_fffffffffffff9c0);
        bVar2 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)in_stack_fffffffffffff9c0);
        std::bitset<100UL>::reference::~reference(&local_1d8);
        if ((bVar2 & 1) != 0) {
          std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2a45c6);
          in_stack_fffffffffffff9c8 =
               TreeDecomposition::getAttribute
                         ((TreeDecomposition *)CONCAT17(bVar2,in_stack_fffffffffffff9d0),
                          (size_t)in_stack_fffffffffffff9c8);
          local_1e0 = in_stack_fffffffffffff9c8;
          std::operator+(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
          std::__cxx11::string::operator+=(local_1b8,local_200);
          std::__cxx11::string::~string(local_200);
          std::__cxx11::string::~string(local_220);
        }
      }
      local_228 = (QueryCompiler *)0x0;
      while (in_stack_fffffffffffff9c0 = local_228,
            pQVar3 = (QueryCompiler *)
                     std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size
                               (&local_198->_aggregates), in_stack_fffffffffffff9c0 < pQVar3) {
        std::__cxx11::to_string((unsigned_long)in_RDI);
        std::operator+((char *)in_stack_fffffffffffff9c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff9c0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
        std::__cxx11::string::operator+=(local_1b8,local_248);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_268);
        std::__cxx11::string::~string(local_288);
        local_228 = (QueryCompiler *)
                    ((long)&(local_228->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 1);
      }
      in_stack_fffffffffffff9b8 = local_1b8;
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_2a8);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::~string(local_528);
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string(local_508);
      std::__cxx11::string::~string(local_368);
      std::__cxx11::string::~string(local_388);
      std::__cxx11::string::~string(local_3a8);
      std::__cxx11::string::~string(local_3c8);
      std::__cxx11::string::~string(local_3e8);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::~string(local_408);
      std::__cxx11::string::~string(local_428);
      std::__cxx11::string::~string(local_4c8);
      std::__cxx11::string::~string(local_448);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::string::~string(local_488);
      std::__cxx11::string::~string(local_4a8);
      std::__cxx11::string::~string(local_1b8);
    }
    local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_190->field_0x1;
  }
  offset_abi_cxx11_(in_RDI,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  offset_abi_cxx11_(in_RDI,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  std::__cxx11::string::operator+=((string *)in_RDI,local_548);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_588);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_5a8);
  std::__cxx11::string::~string(local_5c8);
  return (string *)__rhs_00;
}

Assistant:

std::string CppGenerator::genTestFunction()
{
    std::string returnString = "#ifdef TESTING\n"+
        offset(1)+"void ouputViewsForTesting()\n"+
        offset(1)+"{\n"+offset(2)+"std::ofstream ofs(\"test.out\");\n"+
        offset(2)+"ofs << std::fixed << std::setprecision(2);\n";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        if (view->_origin != view->_destination)
            continue;

        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += " << tuple."+attr->_name+" <<\"|\"";
            }
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += " << tuple.aggregates["+std::to_string(agg)+"] << \"|\"";

        fields.pop_back();
        fields.pop_back();
        fields.pop_back();
        
        returnString += offset(2)+"for (size_t i=0; i < "+viewName[viewID]+
            ".size(); ++i)\n"+offset(2)+"{\n"+offset(3)+
            viewName[viewID]+"_tuple& tuple = "+viewName[viewID]+"[i];\n"+
            offset(3)+"ofs "+fields+"\"\\n\";\n"+offset(2)+"}\n";
    }

    returnString += offset(2)+"ofs.close();\n"+offset(1)+"}\n"+"#endif\n";
    return returnString;
}